

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

void __thiscall
pybind11::detail::argument_loader<std::__cxx11::string,pybind11::array&>::
call<void,pybind11::detail::void_type,pybind11_init_pyhenson(pybind11::module_&)::__7&>
          (argument_loader<std::__cxx11::string,pybind11::array&> *this,type *f)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  handle hVar3;
  PyTypeObject *this_00;
  undefined8 uVar4;
  handle *handle;
  runtime_error *this_01;
  long lVar5;
  handle hVar6;
  make_caster<long> conv;
  str_attr_accessor self__;
  handle local_d8;
  object *local_d0;
  undefined1 local_c8 [24];
  object aoStack_b0 [5];
  data_t local_88;
  int local_50;
  string local_48;
  
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(this + 0x18);
  if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)(this + 8) == paVar1) {
    local_48.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_48.field_2._8_8_ = *(undefined8 *)(this + 0x20);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  }
  else {
    local_48.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_48._M_dataplus._M_p =
         (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)(this + 8);
  }
  local_48._M_string_length = *(size_type *)(this + 0x10);
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)(this + 8) = paVar1;
  *(undefined8 *)(this + 0x10) = 0;
  this[0x18] = (argument_loader<std::__cxx11::string,pybind11::array&>)0x0;
  local_88.tail_._0_8_ = (undefined8)((ulong)local_88.tail_._0_8_ & 0xffffffff00000000);
  local_50 = 0;
  local_c8._0_8_ = *(long *)(*(long *)this + 0x38);
  if ((data_t *)local_c8._0_8_ != (data_t *)0x0) {
    ((PyObject *)local_c8._0_8_)->ob_refcnt = ((PyObject *)local_c8._0_8_)->ob_refcnt + 1;
  }
  dtype::dtype((dtype *)&local_d8,0xb);
  uVar4 = local_c8._0_8_;
  hVar6.m_ptr = local_d8.m_ptr;
  object::~object((object *)&local_d8);
  object::~object((object *)local_c8);
  if ((PyObject *)uVar4 == hVar6.m_ptr) {
    array::check_writeable((array *)this);
    lVar2 = *(long *)this;
    if ((long)*(int *)(lVar2 + 0x18) == 0) {
      hVar6.m_ptr = (PyObject *)0x1;
    }
    else {
      hVar6.m_ptr = (PyObject *)0x1;
      lVar5 = 0;
      do {
        hVar6.m_ptr = hVar6.m_ptr * *(long *)(*(long *)(lVar2 + 0x20) + lVar5);
        lVar5 = lVar5 + 8;
      } while ((long)*(int *)(lVar2 + 0x18) * 8 != lVar5);
    }
    hVar3.m_ptr = *(PyObject **)(lVar2 + 0x10);
    aoStack_b0[1].super_handle.m_ptr = (handle)array::strides((array *)this,0);
    local_c8._8_4_ = 1;
    local_c8._16_8_ = (key_type)0x4;
    aoStack_b0[2].super_handle.m_ptr = (handle)(PyObject *)0x0;
    aoStack_b0[3].super_handle.m_ptr = (handle)(PyObject *)0x0;
    local_c8._0_8_ = hVar3.m_ptr;
    aoStack_b0[0].super_handle.m_ptr = (handle)(handle)hVar6.m_ptr;
    if (local_50 != 5) {
      local_d8.m_ptr = (PyObject *)&local_88;
      local_d0 = (object *)local_c8;
      mpark::detail::
      assignment<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::assign_alt<5UL,_henson::Array,_henson::Array>::anon_struct_16_2_0431621f::operator()();
      goto LAB_001ba2d2;
    }
  }
  else {
    local_c8._0_8_ = *(long *)(*(long *)this + 0x38);
    if ((data_t *)local_c8._0_8_ != (data_t *)0x0) {
      ((PyObject *)local_c8._0_8_)->ob_refcnt = ((PyObject *)local_c8._0_8_)->ob_refcnt + 1;
    }
    dtype::dtype((dtype *)&local_d8,0xc);
    uVar4 = local_c8._0_8_;
    hVar6.m_ptr = local_d8.m_ptr;
    object::~object((object *)&local_d8);
    object::~object((object *)local_c8);
    if ((PyObject *)uVar4 == hVar6.m_ptr) {
      array::check_writeable((array *)this);
      lVar2 = *(long *)this;
      if ((long)*(int *)(lVar2 + 0x18) == 0) {
        hVar6.m_ptr = (PyObject *)0x1;
      }
      else {
        hVar6.m_ptr = (PyObject *)0x1;
        lVar5 = 0;
        do {
          hVar6.m_ptr = hVar6.m_ptr * *(long *)(*(long *)(lVar2 + 0x20) + lVar5);
          lVar5 = lVar5 + 8;
        } while ((long)*(int *)(lVar2 + 0x18) * 8 != lVar5);
      }
      hVar3.m_ptr = *(PyObject **)(lVar2 + 0x10);
      aoStack_b0[1].super_handle.m_ptr = (handle)array::strides((array *)this,0);
      local_c8._8_4_ = 2;
      local_c8._16_8_ = (key_type)0x8;
      aoStack_b0[2].super_handle.m_ptr = (handle)(PyObject *)0x0;
      aoStack_b0[3].super_handle.m_ptr = (handle)(PyObject *)0x0;
      local_c8._0_8_ = hVar3.m_ptr;
      aoStack_b0[0].super_handle.m_ptr = (handle)(handle)hVar6.m_ptr;
      if (local_50 != 5) {
        local_d8.m_ptr = (PyObject *)&local_88;
        local_d0 = (object *)local_c8;
        mpark::detail::
        assignment<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::assign_alt<5UL,_henson::Array,_henson::Array>::anon_struct_16_2_0431621f::operator()();
        goto LAB_001ba2d2;
      }
    }
    else {
      local_c8._0_8_ = *(long *)(*(long *)this + 0x38);
      if ((data_t *)local_c8._0_8_ != (data_t *)0x0) {
        ((PyObject *)local_c8._0_8_)->ob_refcnt = ((PyObject *)local_c8._0_8_)->ob_refcnt + 1;
      }
      dtype::dtype((dtype *)&local_d8,5);
      uVar4 = local_c8._0_8_;
      hVar6.m_ptr = local_d8.m_ptr;
      object::~object((object *)&local_d8);
      object::~object((object *)local_c8);
      if ((PyObject *)uVar4 == hVar6.m_ptr) {
        array::check_writeable((array *)this);
        lVar2 = *(long *)this;
        if ((long)*(int *)(lVar2 + 0x18) == 0) {
          hVar6.m_ptr = (PyObject *)0x1;
        }
        else {
          hVar6.m_ptr = (PyObject *)0x1;
          lVar5 = 0;
          do {
            hVar6.m_ptr = hVar6.m_ptr * *(long *)(*(long *)(lVar2 + 0x20) + lVar5);
            lVar5 = lVar5 + 8;
          } while ((long)*(int *)(lVar2 + 0x18) * 8 != lVar5);
        }
        hVar3.m_ptr = *(PyObject **)(lVar2 + 0x10);
        aoStack_b0[1].super_handle.m_ptr = (handle)array::strides((array *)this,0);
        local_c8._8_4_ = 3;
        local_c8._16_8_ = (key_type)0x4;
        aoStack_b0[2].super_handle.m_ptr = (handle)(PyObject *)0x0;
        aoStack_b0[3].super_handle.m_ptr = (handle)(PyObject *)0x0;
        local_c8._0_8_ = hVar3.m_ptr;
        aoStack_b0[0].super_handle.m_ptr = (handle)(handle)hVar6.m_ptr;
        if (local_50 != 5) {
          local_d8.m_ptr = (PyObject *)&local_88;
          local_d0 = (object *)local_c8;
          mpark::detail::
          assignment<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::assign_alt<5UL,_henson::Array,_henson::Array>::anon_struct_16_2_0431621f::operator()();
          goto LAB_001ba2d2;
        }
      }
      else {
        local_c8._0_8_ = *(long *)(*(long *)this + 0x38);
        if ((data_t *)local_c8._0_8_ != (data_t *)0x0) {
          ((PyObject *)local_c8._0_8_)->ob_refcnt = ((PyObject *)local_c8._0_8_)->ob_refcnt + 1;
        }
        dtype::dtype((dtype *)&local_d8,7);
        uVar4 = local_c8._0_8_;
        hVar6.m_ptr = local_d8.m_ptr;
        object::~object((object *)&local_d8);
        object::~object((object *)local_c8);
        if ((PyObject *)uVar4 != hVar6.m_ptr) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"Unknown array dtype");
          __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        array::check_writeable((array *)this);
        lVar2 = *(long *)this;
        if ((long)*(int *)(lVar2 + 0x18) == 0) {
          hVar6.m_ptr = (PyObject *)0x1;
        }
        else {
          hVar6.m_ptr = (PyObject *)0x1;
          lVar5 = 0;
          do {
            hVar6.m_ptr = hVar6.m_ptr * *(long *)(*(long *)(lVar2 + 0x20) + lVar5);
            lVar5 = lVar5 + 8;
          } while ((long)*(int *)(lVar2 + 0x18) * 8 != lVar5);
        }
        hVar3.m_ptr = *(PyObject **)(lVar2 + 0x10);
        aoStack_b0[1].super_handle.m_ptr = (handle)array::strides((array *)this,0);
        local_c8._8_4_ = 4;
        local_c8._16_8_ = (key_type)0x8;
        aoStack_b0[2].super_handle.m_ptr = (handle)(PyObject *)0x0;
        aoStack_b0[3].super_handle.m_ptr = (handle)(PyObject *)0x0;
        local_c8._0_8_ = hVar3.m_ptr;
        aoStack_b0[0].super_handle.m_ptr = (handle)(handle)hVar6.m_ptr;
        if (local_50 != 5) {
          local_d8.m_ptr = (PyObject *)&local_88;
          local_d0 = (object *)local_c8;
          mpark::detail::
          assignment<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::assign_alt<5UL,_henson::Array,_henson::Array>::anon_struct_16_2_0431621f::operator()();
          goto LAB_001ba2d2;
        }
      }
    }
  }
  uVar4 = local_88._48_8_;
  local_88._32_8_ = aoStack_b0[1].super_handle.m_ptr;
  local_88._16_8_ = local_c8._16_8_;
  local_88._24_8_ = aoStack_b0[0].super_handle.m_ptr;
  local_88.tail_._0_8_ = (undefined8)(alt<1UL,_unsigned_long>)local_c8._0_8_;
  local_88._8_8_ = local_c8._8_8_;
  aoStack_b0[2].super_handle.m_ptr = (handle)(PyObject *)0x0;
  aoStack_b0[3].super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_88._40_8_ = 0;
  local_88._48_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
  }
LAB_001ba2d2:
  if (aoStack_b0[3].super_handle.m_ptr != (PyObject *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aoStack_b0[3].super_handle.m_ptr);
  }
  module_::import((module_ *)&local_d8,"pyhenson");
  local_c8._8_8_ = local_d8.m_ptr;
  local_c8._16_8_ = "self";
  aoStack_b0[0].super_handle.m_ptr = (handle)(PyObject *)0x0;
  object::~object((object *)&local_d8);
  handle = &accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                      ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_c8)->
            super_handle;
  load_type<long,void>((type_caster<long,_void> *)&local_d8,handle);
  hVar6.m_ptr = local_d8.m_ptr;
  object::~object(aoStack_b0);
  this_00 = hVar6.m_ptr[9].ob_type;
  mpark::detail::
  copy_constructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
  ::copy_constructor((copy_constructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
                      *)local_c8,
                     (copy_constructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
                      *)&local_88.head_);
  henson::NameMap::add((NameMap *)this_00,&local_48,(Value *)local_c8);
  mpark::detail::
  destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
  ::~destructor((destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
                 *)local_c8);
  mpark::detail::
  destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
  ::~destructor((destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
                 *)&local_88.head_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

enable_if_t<std::is_void<Return>::value, void_type> call(Func &&f) && {
        std::move(*this).template call_impl<remove_cv_t<Return>>(
            std::forward<Func>(f), indices{}, Guard{});
        return void_type();
    }